

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int searcher_preload(lua_State *L)

{
  int iVar1;
  char *k;
  char *name;
  lua_State *L_local;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  lua_getfield(L,-0xf4628,"_PRELOAD");
  iVar1 = lua_getfield(L,-1,k);
  if (iVar1 == 0) {
    lua_pushfstring(L,"no field package.preload[\'%s\']",k);
    L_local._4_4_ = 1;
  }
  else {
    lua_pushstring(L,":preload:");
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

static int searcher_preload (lua_State *L) {
  const char *name = luaL_checkstring(L, 1);
  lua_getfield(L, LUA_REGISTRYINDEX, LUA_PRELOAD_TABLE);
  if (lua_getfield(L, -1, name) == LUA_TNIL) {  /* not found? */
    lua_pushfstring(L, "no field package.preload['%s']", name);
    return 1;
  }
  else {
    lua_pushliteral(L, ":preload:");
    return 2;
  }
}